

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::SetProperty(cmMakefile *this,string *prop,char *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  cmValueWithOrigin entry;
  string local_c8;
  cmListFileBacktrace local_a8;
  cmValueWithOrigin local_78;
  
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (value != (char *)0x0) {
      paVar1 = &local_78.Value.field_2;
      local_78.Value._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = strlen(value);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,value,value + sVar3);
      cmSystemTools::ExpandListArgument
                (&local_78.Value,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.Value._M_dataplus._M_p,
                        local_78.Value.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->LinkDirectories,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::_M_erase_at_end
              (&this->IncludeDirectoriesEntries,
               (this->IncludeDirectoriesEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (value == (char *)0x0) {
      return;
    }
    GetBacktrace(&local_a8,this);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    sVar3 = strlen(value);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,value,value + sVar3);
    cmValueWithOrigin::cmValueWithOrigin(&local_78,&local_c8,&local_a8);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
    emplace_back<cmValueWithOrigin>(&this->IncludeDirectoriesEntries,&local_78);
LAB_00364da5:
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              (&local_78.Backtrace.
                super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.Value._M_dataplus._M_p != &local_78.Value.field_2) {
      operator_delete(local_78.Value._M_dataplus._M_p,
                      local_78.Value.field_2._M_allocated_capacity + 1);
    }
    local_78.Value._M_dataplus._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_00364de3;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)prop);
    if (iVar2 == 0) {
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::_M_erase_at_end
                (&this->CompileOptionsEntries,
                 (this->CompileOptionsEntries).
                 super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (value == (char *)0x0) {
        return;
      }
      GetBacktrace(&local_a8,this);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      sVar3 = strlen(value);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,value,value + sVar3);
      cmValueWithOrigin::cmValueWithOrigin(&local_78,&local_c8,&local_a8);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
      emplace_back<cmValueWithOrigin>(&this->CompileOptionsEntries,&local_78);
      goto LAB_00364da5;
    }
    iVar2 = std::__cxx11::string::compare((char *)prop);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)prop);
      if (iVar2 == 0) {
        pcVar4 = (char *)(this->IncludeFileRegularExpression)._M_string_length;
        strlen(value);
        std::__cxx11::string::_M_replace
                  ((ulong)&this->IncludeFileRegularExpression,0,pcVar4,(ulong)value);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)prop);
      if (iVar2 == 0) {
        pcVar4 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
        __s2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
        iVar2 = strcmp(pcVar4,__s2);
        if (iVar2 != 0) {
          return;
        }
      }
      cmPropertyMap::SetProperty(&this->Properties,prop,value);
      return;
    }
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::_M_erase_at_end
              (&this->CompileDefinitionsEntries,
               (this->CompileDefinitionsEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (value == (char *)0x0) {
      return;
    }
    GetBacktrace(&local_a8,this);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    sVar3 = strlen(value);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,value,value + sVar3);
    cmValueWithOrigin::cmValueWithOrigin(&local_78,&local_c8,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
              (&this->CompileDefinitionsEntries,&local_78);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              (&local_78.Backtrace.
                super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
    local_c8.field_2._M_allocated_capacity = local_78.Value.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.Value._M_dataplus._M_p == &local_78.Value.field_2) goto LAB_00364de3;
  }
  operator_delete(local_78.Value._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
LAB_00364de3:
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmMakefile::SetProperty(const std::string& prop, const char* value)
{
  if ( prop == "LINK_DIRECTORIES" )
    {
    std::vector<std::string> varArgsExpanded;
    if(value)
      {
      cmSystemTools::ExpandListArgument(value, varArgsExpanded);
      }
    this->SetLinkDirectories(varArgsExpanded);
    return;
    }
  if (prop == "INCLUDE_DIRECTORIES")
    {
    this->IncludeDirectoriesEntries.clear();
      if (!value)
        {
        return;
        }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->IncludeDirectoriesEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    this->CompileOptionsEntries.clear();
      if (!value)
        {
        return;
        }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileOptionsEntries.push_back(cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    this->CompileDefinitionsEntries.clear();
    if (!value)
      {
      return;
      }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->CompileDefinitionsEntries.push_back(entry);
    return;
    }

  if ( prop == "INCLUDE_REGULAR_EXPRESSION" )
    {
    this->SetIncludeRegularExpression(value);
    return;
    }

  if ( prop == "ADDITIONAL_MAKE_CLEAN_FILES" )
    {
    // This property is not inherrited
    if ( strcmp(this->GetCurrentSourceDirectory(),
                this->GetCurrentSourceDirectory()) != 0 )
      {
      return;
      }
    }

  this->Properties.SetProperty(prop, value);
}